

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcold.c
# Opt level: O1

int ffr8fi1(double *input,long ntodo,double scale,double zero,uchar *output,int *status)

{
  long lVar1;
  uchar uVar2;
  double dVar3;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    if (0 < ntodo) {
      lVar1 = 0;
      do {
        dVar3 = (input[lVar1] - zero) / scale;
        if (-0.49 <= dVar3) {
          if (dVar3 <= 255.49) {
            uVar2 = (uchar)(int)(dVar3 + 0.5);
          }
          else {
            *status = -0xb;
            uVar2 = 0xff;
          }
        }
        else {
          *status = -0xb;
          uVar2 = '\0';
        }
        output[lVar1] = uVar2;
        lVar1 = lVar1 + 1;
      } while (ntodo != lVar1);
    }
  }
  else if (0 < ntodo) {
    lVar1 = 0;
    do {
      dVar3 = input[lVar1];
      if (-0.49 <= dVar3) {
        if (dVar3 <= 255.49) {
          uVar2 = (uchar)(int)dVar3;
        }
        else {
          *status = -0xb;
          uVar2 = 0xff;
        }
      }
      else {
        *status = -0xb;
        uVar2 = '\0';
      }
      output[lVar1] = uVar2;
      lVar1 = lVar1 + 1;
    } while (ntodo != lVar1);
  }
  return *status;
}

Assistant:

int ffr8fi1(double *input,         /* I - array of values to be converted  */
            long ntodo,            /* I - number of elements in the array  */
            double scale,          /* I - FITS TSCALn or BSCALE value      */
            double zero,           /* I - FITS TZEROn or BZERO  value      */
            unsigned char *output, /* O - output array of converted values */
            int *status)           /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required.
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
        {
            if (input[ii] < DUCHAR_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = 0;
            }
            else if (input[ii] > DUCHAR_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = UCHAR_MAX;
            }
            else
                output[ii] = (unsigned char) input[ii];
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DUCHAR_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = 0;
            }
            else if (dvalue > DUCHAR_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = UCHAR_MAX;
            }
            else
                output[ii] = (unsigned char) (dvalue + .5);
        }
    }
    return(*status);
}